

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

SQFunctionProto *
SQFunctionProto::Create
          (SQSharedState *ss,SQUnsignedInteger lang_features,SQInteger ninstructions,
          SQInteger nliterals,SQInteger nparameters,SQInteger nfunctions,SQInteger noutervalues,
          SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)

{
  SQFunctionProto *pSVar1;
  SQFunctionProto *in_RCX;
  long in_RDX;
  SQUnsignedInteger in_RSI;
  undefined8 *in_RDI;
  SQSharedState *in_R8;
  long in_R9;
  SQInteger n_4;
  SQInteger n_3;
  SQInteger n_2;
  SQInteger n_1;
  SQInteger n;
  SQFunctionProto *f;
  SQUnsignedInteger in_stack_ffffffffffffff98;
  SQAllocContext in_stack_ffffffffffffffa0;
  SQLocalVarInfo *this;
  long local_58;
  SQOuterVar *this_00;
  long local_48;
  long local_40;
  
  pSVar1 = (SQFunctionProto *)sq_vm_malloc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  SQFunctionProto(in_RCX,in_R8);
  pSVar1->_alloc_ctx = (SQAllocContext)*in_RDI;
  pSVar1->lang_features = in_RSI;
  pSVar1->_ninstructions = in_RDX;
  pSVar1->_literals = (SQObjectPtr *)(pSVar1->_instructions + in_RDX);
  pSVar1->_nliterals = (SQInteger)in_RCX;
  pSVar1->_parameters = pSVar1->_literals + (long)in_RCX;
  pSVar1->_nparameters = (SQInteger)in_R8;
  pSVar1->_functions = pSVar1->_parameters + (long)in_R8;
  pSVar1->_nfunctions = in_R9;
  pSVar1->_outervalues = (SQOuterVar *)(pSVar1->_functions + in_R9);
  pSVar1->_noutervalues = n_4;
  pSVar1->_lineinfos = (SQLineInfo *)(pSVar1->_outervalues + n_4);
  pSVar1->_nlineinfos = n_3;
  pSVar1->_localvarinfos = (SQLocalVarInfo *)(pSVar1->_lineinfos + n_3);
  pSVar1->_nlocalvarinfos = n_2;
  pSVar1->_defaultparams = (SQInteger *)(pSVar1->_localvarinfos + n_2);
  pSVar1->_ndefaultparams = n_1;
  for (local_40 = 0; local_40 < pSVar1->_nliterals; local_40 = local_40 + 1) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  for (local_48 = 0; local_48 < pSVar1->_nparameters; local_48 = local_48 + 1) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  for (this_00 = (SQOuterVar *)0x0; (long)this_00 < pSVar1->_nfunctions;
      this_00 = (SQOuterVar *)((long)&this_00->_type + 1)) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  for (local_58 = 0; local_58 < pSVar1->_noutervalues; local_58 = local_58 + 1) {
    SQOuterVar::SQOuterVar(this_00);
  }
  for (this = (SQLocalVarInfo *)0x0; (long)this < pSVar1->_nlocalvarinfos;
      this = (SQLocalVarInfo *)((long)&(this->_name).super_SQObject._type + 1)) {
    SQLocalVarInfo::SQLocalVarInfo(this);
  }
  return pSVar1;
}

Assistant:

static SQFunctionProto *Create(SQSharedState *ss,
        SQUnsignedInteger lang_features,
        SQInteger ninstructions,
        SQInteger nliterals,SQInteger nparameters,
        SQInteger nfunctions,SQInteger noutervalues,
        SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)
    {
        SQFunctionProto *f;
        //I compact the whole class and members in a single memory allocation
        f = (SQFunctionProto *)sq_vm_malloc(ss->_alloc_ctx,
            _FUNC_SIZE(ninstructions,nliterals,nparameters,nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams));

        new (f) SQFunctionProto(ss);
        f->_alloc_ctx = ss->_alloc_ctx;
        f->lang_features = lang_features;
        f->_ninstructions = ninstructions;
        f->_literals = (SQObjectPtr*)&f->_instructions[ninstructions];
        f->_nliterals = nliterals;
        f->_parameters = (SQObjectPtr*)&f->_literals[nliterals];
        f->_nparameters = nparameters;
        f->_functions = (SQObjectPtr*)&f->_parameters[nparameters];
        f->_nfunctions = nfunctions;
        f->_outervalues = (SQOuterVar*)&f->_functions[nfunctions];
        f->_noutervalues = noutervalues;
        f->_lineinfos = (SQLineInfo *)&f->_outervalues[noutervalues];
        f->_nlineinfos = nlineinfos;
        f->_localvarinfos = (SQLocalVarInfo *)&f->_lineinfos[nlineinfos];
        f->_nlocalvarinfos = nlocalvarinfos;
        f->_defaultparams = (SQInteger *)&f->_localvarinfos[nlocalvarinfos];
        f->_ndefaultparams = ndefaultparams;

        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nliterals,f->_literals);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nparameters,f->_parameters);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nfunctions,f->_functions);
        _CONSTRUCT_VECTOR(SQOuterVar,f->_noutervalues,f->_outervalues);
        //_CONSTRUCT_VECTOR(SQLineInfo,f->_nlineinfos,f->_lineinfos); //not required are 2 integers
        _CONSTRUCT_VECTOR(SQLocalVarInfo,f->_nlocalvarinfos,f->_localvarinfos);
        return f;
    }